

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int LogLuvEncode24(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined6 in_register_0000000a;
  uint8_t *puVar4;
  long lVar5;
  uint8_t *puVar6;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x22b,"int LogLuvEncode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar4 = tif->tif_data;
  if (puVar4 != (uint8_t *)0x0) {
    lVar2 = cc / (long)*(int *)(puVar4 + 0xc);
    puVar6 = bp;
    if (*(int *)(puVar4 + 4) != 2) {
      if (*(long *)(puVar4 + 0x18) < lVar2) {
        TIFFErrorExtR(tif,"LogLuvEncode24","Translation buffer too short");
        return 0;
      }
      puVar6 = *(uint8_t **)(puVar4 + 0x10);
      (**(code **)(puVar4 + 0x20))(puVar4,bp,lVar2);
    }
    puVar4 = tif->tif_rawcp;
    lVar3 = tif->tif_rawdatasize - tif->tif_rawcc;
    lVar5 = 0;
    do {
      if (lVar2 == lVar5) {
        tif->tif_rawcp = puVar4;
        tif->tif_rawcc = tif->tif_rawdatasize - lVar3;
        return 1;
      }
      if (lVar3 < 3) {
        tif->tif_rawcp = puVar4;
        tif->tif_rawcc = tif->tif_rawdatasize - lVar3;
        iVar1 = TIFFFlushData1(tif);
        if (iVar1 == 0) {
          return 0;
        }
        puVar4 = tif->tif_rawcp;
        lVar3 = tif->tif_rawdatasize - tif->tif_rawcc;
      }
      *puVar4 = puVar6[lVar5 * 4 + 2];
      puVar4[1] = puVar6[lVar5 * 4 + 1];
      puVar4[2] = puVar6[lVar5 * 4];
      puVar4 = puVar4 + 3;
      lVar3 = lVar3 + -3;
      lVar5 = lVar5 + 1;
    } while( true );
  }
  __assert_fail("sp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                ,0x22c,"int LogLuvEncode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
}

Assistant:

static int LogLuvEncode24(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "LogLuvEncode24";
    LogLuvState *sp = EncoderState(tif);
    tmsize_t i;
    tmsize_t npixels;
    tmsize_t occ;
    uint8_t *op;
    uint32_t *tp;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);
    npixels = cc / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_RAW)
        tp = (uint32_t *)bp;
    else
    {
        tp = (uint32_t *)sp->tbuf;
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        (*sp->tfunc)(sp, bp, npixels);
    }
    /* write out encoded pixels */
    op = tif->tif_rawcp;
    occ = tif->tif_rawdatasize - tif->tif_rawcc;
    for (i = npixels; i--;)
    {
        if (occ < 3)
        {
            tif->tif_rawcp = op;
            tif->tif_rawcc = tif->tif_rawdatasize - occ;
            if (!TIFFFlushData1(tif))
                return (0);
            op = tif->tif_rawcp;
            occ = tif->tif_rawdatasize - tif->tif_rawcc;
        }
        *op++ = (uint8_t)(*tp >> 16);
        *op++ = (uint8_t)(*tp >> 8 & 0xff);
        *op++ = (uint8_t)(*tp++ & 0xff);
        occ -= 3;
    }
    tif->tif_rawcp = op;
    tif->tif_rawcc = tif->tif_rawdatasize - occ;

    return (1);
}